

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O1

string * __thiscall
czh::lexer::Match::error_correct_abi_cxx11_(string *__return_storage_ptr__,Match *this)

{
  undefined8 extraout_RAX;
  char *pcVar1;
  char *pcVar2;
  source_location local_38;
  string local_30;
  
  switch(this->last_state) {
  case INIT:
  case REF:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "identifier";
    pcVar1 = "";
    break;
  case ID:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "\'=\' or \':\'";
    pcVar1 = "";
    break;
  default:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Unexpected token","");
    local_38._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0019f390;
    czh::error::czh_unreachable(&local_30,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  case ARR_VALUE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "\']\' or \',\'";
    pcVar1 = "";
    break;
  case EQUAL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "value or \'[\'";
    pcVar1 = "";
    break;
  case ARR_LP:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "value or \']\'";
    pcVar1 = "";
    break;
  case COMMA:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "value";
    pcVar1 = "";
    break;
  case REF_ID:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "\'::\'";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string error_correct()
    {
      switch (last_state)
      {
        case State::REF:
        case State::INIT:
          return "identifier";
        case State::ID:
          return "'=' or ':'";
        case State::EQUAL:
          return "value or '['";
        case State::ARR_LP:
          return "value or ']'";
        case State::ARR_VALUE:
          return "']' or ','";
        case State::COMMA:
          return "value";
        case State::REF_ID:
          return "'::'";
        default:
          error::czh_unreachable("Unexpected token");
      }
      error::czh_unreachable("Unexpected token");
      return "";
    }